

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warehouseapp.cpp
# Opt level: O2

vector<Product,_std::allocator<Product>_> * __thiscall
WarehouseServer::AllProducts
          (vector<Product,_std::allocator<Product>_> *__return_storage_ptr__,WarehouseServer *this)

{
  _Base_ptr p_Var1;
  
  (__return_storage_ptr__->super__Vector_base<Product,_std::allocator<Product>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Product,_std::allocator<Product>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Product,_std::allocator<Product>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (this->products)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->products)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::vector<Product,_std::allocator<Product>_>::push_back
              (__return_storage_ptr__,(value_type *)(p_Var1 + 2));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Product> WarehouseServer::AllProducts() {
  std::vector<Product> result;
  for (const auto &p : products)
    result.push_back(p.second);
  return result;
}